

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O1

void I_PutInClipboard(char *str)

{
  return;
}

Assistant:

void I_PutInClipboard (const char *str)
{
#ifndef NO_GTK
	if (GtkAvailable)
	{
		GtkClipboard *clipboard = gtk_clipboard_get(GDK_SELECTION_CLIPBOARD);
		if (clipboard != NULL)
		{
			gtk_clipboard_set_text(clipboard, str, -1);
		}
		/* Should I? I don't know. It's not actually a selection.
		clipboard = gtk_clipboard_get(GDK_SELECTION_PRIMARY);
		if (clipboard != NULL)
		{
			gtk_clipboard_set_text(clipboard, str, -1);
		}
		*/
	}
#elif defined __APPLE__
	if (NULL == s_clipboard)
	{
		PasteboardCreate(kPasteboardClipboard, &s_clipboard);
	}

	PasteboardClear(s_clipboard);
	PasteboardSynchronize(s_clipboard);

	const CFDataRef textData = CFDataCreate(kCFAllocatorDefault,
		reinterpret_cast<const UInt8*>(str), strlen(str));

	if (NULL != textData)
	{
		PasteboardPutItemFlavor(s_clipboard, PasteboardItemID(1),
			CFSTR("public.utf8-plain-text"), textData, 0);
	}
#endif
}